

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O0

void __thiscall
vkt::sr::ShaderRenderCaseInstance::createSamplerUniform
          (ShaderRenderCaseInstance *this,deUint32 bindingLocation,Type textureType,Init textureInit
          ,TextureFormat *texFormat,UVec3 *texSize,TextureData *textureData,Sampler *refSampler,
          deUint32 mipLevels,deUint32 arrayLayers,Parameters textureParams)

{
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
  data_00;
  RefData<vk::Handle<(vk::HandleType)9>_> data_01;
  RefData<vk::Handle<(vk::HandleType)9>_> data_02;
  RefData<vk::Handle<(vk::HandleType)13>_> data_03;
  RefData<vk::Handle<(vk::HandleType)20>_> data_04;
  DeviceInterface *pDVar1;
  DeviceInterface *pDVar2;
  UVec3 *texFormat_00;
  Init IVar3;
  VkImageViewType type;
  VkImageType imageType_00;
  VkFormat VVar4;
  VkResult result;
  Handle<(vk::HandleType)9> *pHVar5;
  Allocation *pAVar6;
  VkDeviceSize VVar7;
  Handle<(vk::HandleType)20> *pHVar8;
  Handle<(vk::HandleType)13> *pHVar9;
  SamplerUniform *pSVar10;
  Unique<vk::Handle<(vk::HandleType)9>_> *this_00;
  Unique<vk::Handle<(vk::HandleType)13>_> *this_01;
  Unique<vk::Handle<(vk::HandleType)20>_> *this_02;
  DescriptorSetLayoutBuilder *this_03;
  DescriptorPoolBuilder *this_04;
  UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
  *this_05;
  MovePtr *pMVar11;
  bool local_3a9;
  SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>
  local_398;
  SharedPtr<vk::Allocation> local_388;
  RefData<vk::Handle<(vk::HandleType)20>_> local_378;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)20>_>_> local_358;
  RefData<vk::Handle<(vk::HandleType)13>_> local_348;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> local_328;
  RefData<vk::Handle<(vk::HandleType)9>_> local_318;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_> local_2f8;
  DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform> local_2e1;
  undefined1 local_2e0 [8];
  MovePtr<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
  uniform;
  VkDescriptorImageInfo descriptor;
  Move<vk::Handle<(vk::HandleType)13>_> imageView;
  VkImageViewCreateInfo viewParams;
  VkComponentMapping components;
  undefined1 local_230 [4];
  deUint32 baseMipLevel;
  Move<vk::Handle<(vk::HandleType)20>_> sampler;
  VkSamplerCreateInfo samplerParams;
  Vector<unsigned_int,_3> local_1ac;
  VkImage local_1a0;
  deUint64 local_198;
  deUint64 local_190;
  undefined4 local_184;
  deUint64 local_180;
  VkMemoryRequirements local_178;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_160;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_150;
  Move<vk::Handle<(vk::HandleType)9>_> local_140;
  RefData<vk::Handle<(vk::HandleType)9>_> local_120;
  undefined1 local_100 [8];
  VkImageCreateInfo imageParams;
  undefined1 local_98 [8];
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> allocation;
  Move<vk::Handle<(vk::HandleType)9>_> vkTexture;
  uint local_60;
  VkImageUsageFlags imageUsageFlags;
  VkImageCreateFlags imageCreateFlags;
  bool isCube;
  VkFormat format;
  VkImageType imageType;
  VkImageViewType imageViewType;
  VkImageAspectFlags aspectMask;
  bool isShadowSampler;
  DeviceInterface *pDStack_40;
  deUint32 queueFamilyIndex;
  DeviceInterface *vk;
  VkDevice vkDevice;
  UVec3 *texSize_local;
  TextureFormat *texFormat_local;
  Type local_18;
  Init textureInit_local;
  Type textureType_local;
  deUint32 bindingLocation_local;
  ShaderRenderCaseInstance *this_local;
  
  vkDevice = (VkDevice)texSize;
  texSize_local = (UVec3 *)texFormat;
  texFormat_local._4_4_ = textureInit;
  local_18 = textureType;
  textureInit_local = bindingLocation;
  _textureType_local = this;
  vk = (DeviceInterface *)getDevice(this);
  pDStack_40 = getDeviceInterface(this);
  aspectMask = getUniversalQueueFamilyIndex(this);
  type = sr::anon_unknown_0::textureTypeToImageViewType(local_18);
  imageType_00 = sr::anon_unknown_0::viewTypeToImageType(type);
  VVar4 = ::vk::mapTextureFormat((TextureFormat *)texSize_local);
  local_3a9 = type == VK_IMAGE_VIEW_TYPE_CUBE || type == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY;
  local_60 = (uint)local_3a9 << 4;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::Move
            ((Move<vk::Handle<(vk::HandleType)9>_> *)
             &allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_98);
  if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) {
    checkSparseSupport(this,imageType_00);
    local_60 = local_60 | 3;
  }
  local_100._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext._0_4_ = local_60;
  imageParams.pNext._4_4_ = imageType_00;
  imageParams.flags = VVar4;
  imageParams.imageType = tcu::Vector<unsigned_int,_3>::x(texSize);
  imageParams.format = tcu::Vector<unsigned_int,_3>::y(texSize);
  imageParams.extent.width = tcu::Vector<unsigned_int,_3>::z(texSize);
  imageParams.extent.height = mipLevels;
  imageParams.extent.depth = arrayLayers;
  imageParams.mipLevels = textureParams.samples;
  imageParams.arrayLayers = 0;
  imageParams.samples = VK_SAMPLE_COUNT_4_BIT|VK_SAMPLE_COUNT_2_BIT;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 1;
  imageParams._64_8_ = &aspectMask;
  imageParams.pQueueFamilyIndices._0_4_ = 0;
  ::vk::createImage(&local_140,pDStack_40,(VkDevice)vk,(VkImageCreateInfo *)local_100,
                    (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_120,(Move *)&local_140);
  data_01.deleter.m_deviceIface = local_120.deleter.m_deviceIface;
  data_01.object.m_internal = local_120.object.m_internal;
  data_01.deleter.m_device = local_120.deleter.m_device;
  data_01.deleter.m_allocator = local_120.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)9>_> *)
             &allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_140);
  pDVar2 = vk;
  pDVar1 = pDStack_40;
  pMVar11 = (MovePtr *)this->m_memAlloc;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                      &allocation.
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                       field_0x8);
  local_180 = pHVar5->m_internal;
  ::vk::getImageMemoryRequirements(&local_178,pDVar1,(VkDevice)pDVar2,(VkImage)local_180);
  local_184 = ::vk::MemoryRequirement::Any;
  (**(code **)(*(long *)pMVar11 + 0x18))(&local_160,pMVar11,&local_178,::vk::MemoryRequirement::Any)
  ;
  local_150 = de::details::MovePtr::operator_cast_to_PtrData(&local_160,pMVar11);
  data._8_8_ = local_120.deleter.m_deviceIface;
  data.ptr = (Allocation *)local_120.object.m_internal;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_98,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_160);
  pDVar2 = vk;
  pDVar1 = pDStack_40;
  if (this->m_imageBackingMode != IMAGE_BACKING_MODE_SPARSE) {
    pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                       ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                        &allocation.
                         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                         m_data.field_0x8);
    local_190 = pHVar5->m_internal;
    pAVar6 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
             operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_98)
    ;
    local_198 = (deUint64)::vk::Allocation::getMemory(pAVar6);
    pAVar6 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
             operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_98)
    ;
    VVar7 = ::vk::Allocation::getOffset(pAVar6);
    result = (*pDVar1->_vptr_DeviceInterface[0xd])(pDVar1,pDVar2,local_190,local_198,VVar7);
    ::vk::checkResult(result,
                      "vk.bindImageMemory(vkDevice, *vkTexture, allocation->getMemory(), allocation->getOffset())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                      ,0x818);
  }
  texFormat_00 = texSize_local;
  if (texFormat_local._4_4_ == INIT_UPLOAD_DATA) {
    if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) {
      pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                         ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                          &allocation.
                           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                           m_data.field_0x8);
      local_1a0.m_internal = pHVar5->m_internal;
      tcu::Vector<unsigned_int,_3>::Vector(&local_1ac,texSize);
      uploadSparseImage(this,(TextureFormat *)texFormat_00,textureData,refSampler,mipLevels,
                        arrayLayers,local_1a0,(VkImageCreateInfo *)local_100,&local_1ac);
    }
    else {
      pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                         ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                          &allocation.
                           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                           m_data.field_0x8);
      uploadImage(this,(TextureFormat *)texFormat_00,textureData,refSampler,mipLevels,arrayLayers,
                  (VkImage)pHVar5->m_internal);
    }
  }
  else if (texFormat_local._4_4_ == INIT_CLEAR) {
    pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                       ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                        &allocation.
                         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                         m_data.field_0x8);
    clearImage(this,refSampler,mipLevels,arrayLayers,(VkImage)pHVar5->m_internal);
  }
  ::vk::mapSampler((VkSamplerCreateInfo *)
                   &sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.
                    m_allocator,refSampler,(TextureFormat *)texSize_local,0.0,1000.0);
  ::vk::createSampler((Move<vk::Handle<(vk::HandleType)20>_> *)local_230,pDStack_40,(VkDevice)vk,
                      (VkSamplerCreateInfo *)
                      &sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.
                       m_allocator,(VkAllocationCallbacks *)0x0);
  imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator._0_4_ = 0xf;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
             &allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8);
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&descriptor.imageLayout,pDStack_40,
             (VkDevice)vk,
             (VkImageViewCreateInfo *)
             &imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator,
             (VkAllocationCallbacks *)0x0);
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)20>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)20>_> *)local_230);
  uniform.
  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
  .m_data._8_8_ = pHVar8->m_internal;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&descriptor.imageLayout);
  descriptor.sampler.m_internal = pHVar9->m_internal;
  descriptor.imageView.m_internal._0_4_ = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
  pSVar10 = (SamplerUniform *)operator_new(0x68);
  SamplerUniform::SamplerUniform(pSVar10);
  de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>::DefaultDeleter(&local_2e1);
  de::details::
  MovePtr<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
  ::MovePtr((MovePtr<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
             *)local_2e0,pSVar10);
  pSVar10 = de::details::
            UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
            ::operator->((UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
                          *)local_2e0);
  (pSVar10->super_UniformInfo).type = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
  pSVar10 = de::details::
            UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
            ::operator->((UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
                          *)local_2e0);
  IVar3 = textureInit_local;
  (pSVar10->descriptor).imageLayout = (VkImageLayout)descriptor.imageView.m_internal;
  (pSVar10->descriptor).sampler.m_internal =
       uniform.
       super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
       .m_data._8_8_;
  (pSVar10->descriptor).imageView.m_internal = descriptor.sampler.m_internal;
  pSVar10 = de::details::
            UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
            ::operator->((UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
                          *)local_2e0);
  (pSVar10->super_UniformInfo).location = IVar3;
  this_00 = (Unique<vk::Handle<(vk::HandleType)9>_> *)operator_new(0x20);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_318,
             (Move *)&allocation.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      field_0x8);
  data_02.deleter.m_deviceIface = local_318.deleter.m_deviceIface;
  data_02.object.m_internal = local_318.object.m_internal;
  data_02.deleter.m_device = local_318.deleter.m_device;
  data_02.deleter.m_allocator = local_318.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::Unique(this_00,data_02);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>::SharedPtr
            (&local_2f8,this_00);
  pSVar10 = de::details::
            UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
            ::operator->((UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
                          *)local_2e0);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>::operator=
            (&pSVar10->image,&local_2f8);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>::~SharedPtr(&local_2f8);
  this_01 = (Unique<vk::Handle<(vk::HandleType)13>_> *)operator_new(0x20);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_348,(Move *)&descriptor.imageLayout);
  data_03.deleter.m_deviceIface = local_348.deleter.m_deviceIface;
  data_03.object.m_internal = local_348.object.m_internal;
  data_03.deleter.m_device = local_348.deleter.m_device;
  data_03.deleter.m_allocator = local_348.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::Unique(this_01,data_03);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::SharedPtr
            (&local_328,this_01);
  pSVar10 = de::details::
            UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
            ::operator->((UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
                          *)local_2e0);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator=
            (&pSVar10->imageView,&local_328);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::~SharedPtr(&local_328);
  this_02 = (Unique<vk::Handle<(vk::HandleType)20>_> *)operator_new(0x20);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_378,(Move *)local_230);
  data_04.deleter.m_deviceIface = local_378.deleter.m_deviceIface;
  data_04.object.m_internal = local_378.object.m_internal;
  data_04.deleter.m_device = local_378.deleter.m_device;
  data_04.deleter.m_allocator = local_378.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)20>_>::Unique(this_02,data_04);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)20>_>_>::SharedPtr
            (&local_358,this_02);
  pSVar10 = de::details::
            UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
            ::operator->((UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
                          *)local_2e0);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)20>_>_>::operator=
            (&pSVar10->sampler,&local_358);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)20>_>_>::~SharedPtr(&local_358);
  pAVar6 = de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::release
                     ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_98);
  de::SharedPtr<vk::Allocation>::SharedPtr(&local_388,pAVar6);
  pSVar10 = de::details::
            UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
            ::operator->((UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
                          *)local_2e0);
  de::SharedPtr<vk::Allocation>::operator=(&pSVar10->alloc,&local_388);
  de::SharedPtr<vk::Allocation>::~SharedPtr(&local_388);
  this_03 = de::details::
            UniqueBase<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>
            ::operator->(&(this->m_descriptorSetLayoutBuilder).
                          super_UniqueBase<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>
                        );
  ::vk::DescriptorSetLayoutBuilder::addSingleSamplerBinding
            (this_03,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,0x7fffffff,(VkSampler *)0x0);
  this_04 = de::details::
            UniqueBase<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_>::
            operator->(&(this->m_descriptorPoolBuilder).
                        super_UniqueBase<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_>
                      );
  pMVar11 = (MovePtr *)0x1;
  ::vk::DescriptorPoolBuilder::addType(this_04,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,1);
  this_05 = (UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
             *)operator_new(0x10);
  de::details::MovePtr::operator_cast_to_PtrData
            ((PtrData<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
              *)local_2e0,pMVar11);
  data_00._8_8_ = local_378.deleter.m_deviceIface;
  data_00.ptr = (UniformInfo *)local_378.object.m_internal;
  de::details::
  UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
  ::UniquePtr(this_05,data_00);
  de::
  SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>
  ::SharedPtr(&local_398,this_05);
  std::
  vector<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>,_std::allocator<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>_>_>
  ::push_back(&this->m_uniformInfos,&local_398);
  de::
  SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>
  ::~SharedPtr(&local_398);
  de::details::
  MovePtr<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
  ::~MovePtr((MovePtr<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
              *)local_2e0);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&descriptor.imageLayout);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)20>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)20>_> *)local_230);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_98);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)9>_> *)
             &allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8);
  return;
}

Assistant:

void ShaderRenderCaseInstance::createSamplerUniform (deUint32						bindingLocation,
													 TextureBinding::Type			textureType,
													 TextureBinding::Init			textureInit,
													 const tcu::TextureFormat&		texFormat,
													 const tcu::UVec3				texSize,
													 const TextureData&				textureData,
													 const tcu::Sampler&			refSampler,
													 deUint32						mipLevels,
													 deUint32						arrayLayers,
													 TextureBinding::Parameters		textureParams)
{
	const VkDevice					vkDevice			= getDevice();
	const DeviceInterface&			vk					= getDeviceInterface();
	const deUint32					queueFamilyIndex	= getUniversalQueueFamilyIndex();

	const bool						isShadowSampler		= refSampler.compare != tcu::Sampler::COMPAREMODE_NONE;
	const VkImageAspectFlags		aspectMask			= isShadowSampler ? VK_IMAGE_ASPECT_DEPTH_BIT : VK_IMAGE_ASPECT_COLOR_BIT;
	const VkImageViewType			imageViewType		= textureTypeToImageViewType(textureType);
	const VkImageType				imageType			= viewTypeToImageType(imageViewType);
	const VkFormat					format				= mapTextureFormat(texFormat);
	const bool						isCube				= imageViewType == VK_IMAGE_VIEW_TYPE_CUBE || imageViewType == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY;
	VkImageCreateFlags				imageCreateFlags	= isCube ? (VkImageCreateFlags)VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT : (VkImageCreateFlags)0;
	VkImageUsageFlags				imageUsageFlags		= VK_IMAGE_USAGE_SAMPLED_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;
	Move<VkImage>					vkTexture;
	de::MovePtr<Allocation>			allocation;

	if (m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE)
	{
		checkSparseSupport(imageType);
		imageCreateFlags |= VK_IMAGE_CREATE_SPARSE_BINDING_BIT | VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT;
	}

	// Create image
	const VkImageCreateInfo			imageParams =
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,							// VkStructureType			sType;
		DE_NULL,														// const void*				pNext;
		imageCreateFlags,												// VkImageCreateFlags		flags;
		imageType,														// VkImageType				imageType;
		format,															// VkFormat					format;
		{																// VkExtent3D				extent;
			texSize.x(),
			texSize.y(),
			texSize.z()
		},
		mipLevels,														// deUint32					mipLevels;
		arrayLayers,													// deUint32					arrayLayers;
		textureParams.samples,											// VkSampleCountFlagBits	samples;
		VK_IMAGE_TILING_OPTIMAL,										// VkImageTiling			tiling;
		imageUsageFlags,												// VkImageUsageFlags		usage;
		VK_SHARING_MODE_EXCLUSIVE,										// VkSharingMode			sharingMode;
		1u,																// deUint32					queueFamilyIndexCount;
		&queueFamilyIndex,												// const deUint32*			pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED										// VkImageLayout			initialLayout;
	};

	vkTexture		= createImage(vk, vkDevice, &imageParams);
	allocation		= m_memAlloc.allocate(getImageMemoryRequirements(vk, vkDevice, *vkTexture), MemoryRequirement::Any);

	if (m_imageBackingMode != IMAGE_BACKING_MODE_SPARSE)
	{
		VK_CHECK(vk.bindImageMemory(vkDevice, *vkTexture, allocation->getMemory(), allocation->getOffset()));
	}

	switch (textureInit)
	{
		case TextureBinding::INIT_UPLOAD_DATA:
		{
			// upload*Image functions use cmdCopyBufferToImage, which is invalid for multisample images
			DE_ASSERT(textureParams.samples == VK_SAMPLE_COUNT_1_BIT);

			if (m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE)
			{
				uploadSparseImage(texFormat, textureData, refSampler, mipLevels, arrayLayers, *vkTexture, imageParams, texSize);
			}
			else
			{
				// Upload texture data
				uploadImage(texFormat, textureData, refSampler, mipLevels, arrayLayers, *vkTexture);
			}
			break;
		}
		case TextureBinding::INIT_CLEAR:
			clearImage(refSampler, mipLevels, arrayLayers, *vkTexture);
			break;
		default:
			DE_FATAL("Impossible");
	}

	// Create sampler
	const VkSamplerCreateInfo		samplerParams	= mapSampler(refSampler, texFormat);
	Move<VkSampler>					sampler			= createSampler(vk, vkDevice, &samplerParams);
	const deUint32					baseMipLevel	= textureParams.baseMipLevel;
	const vk::VkComponentMapping	components		= textureParams.componentMapping;
	const VkImageViewCreateInfo		viewParams		=
	{
		VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,	// VkStructureType			sType;
		NULL,										// const voide*				pNext;
		0u,											// VkImageViewCreateFlags	flags;
		*vkTexture,									// VkImage					image;
		imageViewType,								// VkImageViewType			viewType;
		format,										// VkFormat					format;
		components,									// VkChannelMapping			channels;
		{
			aspectMask,						// VkImageAspectFlags	aspectMask;
			baseMipLevel,					// deUint32				baseMipLevel;
			mipLevels - baseMipLevel,		// deUint32				mipLevels;
			0,								// deUint32				baseArraySlice;
			arrayLayers						// deUint32				arraySize;
		},											// VkImageSubresourceRange	subresourceRange;
	};

	Move<VkImageView>				imageView		= createImageView(vk, vkDevice, &viewParams);

	const vk::VkDescriptorImageInfo	descriptor		=
	{
		sampler.get(),								// VkSampler				sampler;
		imageView.get(),							// VkImageView				imageView;
		VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,	// VkImageLayout			imageLayout;
	};

	de::MovePtr<SamplerUniform> uniform(new SamplerUniform());
	uniform->type = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
	uniform->descriptor = descriptor;
	uniform->location = bindingLocation;
	uniform->image = VkImageSp(new vk::Unique<VkImage>(vkTexture));
	uniform->imageView = VkImageViewSp(new vk::Unique<VkImageView>(imageView));
	uniform->sampler = VkSamplerSp(new vk::Unique<VkSampler>(sampler));
	uniform->alloc = AllocationSp(allocation.release());

	m_descriptorSetLayoutBuilder->addSingleSamplerBinding(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, vk::VK_SHADER_STAGE_ALL, DE_NULL);
	m_descriptorPoolBuilder->addType(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER);

	m_uniformInfos.push_back(UniformInfoSp(new de::UniquePtr<UniformInfo>(uniform)));
}